

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC.c
# Opt level: O0

void Hacl_HMAC_compute_blake2b_32
               (uint8_t *dst,uint8_t *key,uint32_t key_len,uint8_t *data,uint32_t data_len)

{
  undefined1 prev [16];
  undefined1 prev_00 [16];
  undefined1 prev_01 [16];
  undefined1 prev_02 [16];
  undefined1 prev_03 [16];
  undefined1 prev_04 [16];
  undefined1 auVar1 [16];
  undefined1 *puVar2;
  FStar_UInt128_uint128 *pFVar3;
  uint8_t *puVar4;
  uint32_t nb;
  uint32_t nb_00;
  uint32_t nb_01;
  uint32_t nb_02;
  uint8_t *d;
  uint8_t *d_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint8_t *d_01;
  uint64_t uVar5;
  uint64_t *puVar6;
  undefined4 in_stack_fffffffffffff6fc;
  uint uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 in_stack_fffffffffffff708 [16];
  undefined1 in_stack_fffffffffffff718 [16];
  undefined1 auStack_878 [120];
  undefined8 uStack_800;
  uint8_t auStack_7f8 [136];
  uint64_t **local_770;
  uint32_t local_764;
  uint64_t **local_760;
  uint64_t local_758;
  uint64_t uStack_750;
  undefined8 local_748;
  FStar_UInt128_uint128 *local_740;
  uint32_t local_734;
  uint64_t *local_730;
  uint64_t **local_728;
  uint64_t **local_720;
  uint32_t local_714;
  uint64_t **local_710;
  uint64_t local_708;
  uint64_t uStack_700;
  FStar_UInt128_uint128 *local_6e8;
  uint32_t local_6dc;
  uint64_t *local_6d8;
  uint64_t **local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  uint64_t *local_6b0;
  uint64_t **local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  uint8_t *local_690;
  FStar_UInt128_uint128 *local_688;
  uint8_t *local_680;
  FStar_UInt128_uint128 *local_678;
  uint8_t *local_670;
  FStar_UInt128_uint128 *local_668;
  undefined8 local_660;
  FStar_UInt128_uint128 *local_658;
  undefined8 local_650;
  FStar_UInt128_uint128 *local_648;
  undefined8 local_640;
  FStar_UInt128_uint128 *local_638;
  uint64_t uStack_628;
  uint64_t wv1 [16];
  uint64_t uStack_588;
  uint64_t wv0 [16];
  uint64_t uStack_4e8;
  uint64_t wv [16];
  uint8_t *rem;
  uint8_t *full_blocks;
  uint32_t full_blocks_len;
  uint32_t rem_len;
  uint32_t n_blocks;
  uint32_t n_blocks__1;
  K___uint32_t_uint32_t scrut;
  uint32_t rem0;
  uint32_t n_blocks0;
  uint32_t block_len;
  uint8_t *hash1;
  uint64_t uStack_3b8;
  uint64_t wv1_1 [16];
  uint64_t uStack_318;
  uint64_t wv0_1 [16];
  uint64_t uStack_278;
  uint64_t wv_2 [16];
  uint8_t *rem_1;
  uint8_t *full_blocks_1;
  uint32_t full_blocks_len_1;
  uint32_t rem_len_1;
  uint32_t n_blocks_1;
  uint uStack_1bc;
  uint32_t n_blocks_;
  K___uint32_t_uint32_t scrut_1;
  uint32_t rem0_1;
  uint32_t n_blocks0_1;
  uint32_t block_len_1;
  uint64_t uStack_188;
  uint64_t wv_1 [16];
  uint8_t *dst1;
  uint64_t *s0;
  uint64_t s [16];
  uint8_t yi_1;
  uint8_t xi_1;
  uint32_t i_1;
  unsigned_long __vla_expr2;
  uint8_t yi;
  uint8_t xi;
  uint32_t i;
  unsigned_long __vla_expr1;
  uint8_t *zeroes;
  uint32_t ite;
  uint8_t *nkey;
  unsigned_long __vla_expr0;
  uint32_t l;
  uint32_t data_len_local;
  uint8_t *data_local;
  uint32_t key_len_local;
  uint8_t *key_local;
  uint8_t *dst_local;
  
  local_690 = auStack_7f8;
  uStack_800 = 0x12dc0d;
  memset(local_690,0,0x80);
  if (key_len < 0x81) {
    uStack_800 = 0x12dc60;
    memcpy(local_690,key,(ulong)key_len);
  }
  else {
    uStack_800 = 0x12dc7f;
    Hacl_Hash_Blake2b_hash_with_key(local_690,0x40,key,key_len,(uint8_t *)0x0,0);
  }
  local_698 = auStack_878;
  memset(local_698,0x36,0x80);
  for (__vla_expr2._4_4_ = 0; __vla_expr2._4_4_ < 0x80; __vla_expr2._4_4_ = __vla_expr2._4_4_ + 1) {
    local_698[__vla_expr2._4_4_] = local_698[__vla_expr2._4_4_] ^ local_690[__vla_expr2._4_4_];
  }
  local_6a0 = &stack0xfffffffffffff708;
  memset(local_6a0,0x5c,0x80);
  for (s[0xf]._4_4_ = 0; s[0xf]._4_4_ < 0x80; s[0xf]._4_4_ = s[0xf]._4_4_ + 1) {
    s[0xf]._3_1_ = local_6a0[s[0xf]._4_4_];
    s[0xf]._2_1_ = local_690[s[0xf]._4_4_];
    local_6a0[s[0xf]._4_4_] = s[0xf]._3_1_ ^ s[0xf]._2_1_;
  }
  memset(&s0,0,0x80);
  uVar5 = 0;
  Hacl_Hash_Blake2b_init((uint64_t *)&s0,0,0x40);
  wv_1[0xf] = (uint64_t)local_698;
  if (data_len == 0) {
    local_6c8 = 0;
    uStack_6c0 = 0;
    wv_1[0xd] = 0;
    wv_1[0xe] = 0;
    wv_1[0xb] = 0;
    wv_1[0xc] = 0;
    wv_1[9] = 0;
    wv_1[10] = 0;
    wv_1[7] = 0;
    wv_1[8] = 0;
    wv_1[5] = 0;
    wv_1[6] = 0;
    wv_1[3] = 0;
    wv_1[4] = 0;
    wv_1[1] = 0;
    wv_1[2] = 0;
    uStack_188 = 0;
    wv_1[0] = 0;
    local_6b0 = &uStack_188;
    uVar9 = 0x12de9a;
    local_6a8 = &s0;
    pFVar3 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x0,uVar5);
    uVar7 = (uint)((ulong)local_698 >> 0x20);
    prev._8_8_ = uVar9;
    prev._0_8_ = local_698;
    Hacl_Hash_Blake2b_update_last
              (0x80,local_6b0,(uint64_t *)local_6a8,(FStar_UInt128_uint128)prev,(uint32_t)pFVar3,d);
    puVar4 = (uint8_t *)((ulong)uVar7 << 0x20);
  }
  else {
    uStack_1bc = data_len / 0x80;
    n_blocks_ = data_len % 0x80;
    if ((uStack_1bc != 0) && (n_blocks_ == 0)) {
      uStack_1bc = uStack_1bc - 1;
      n_blocks_ = data_len + uStack_1bc * -0x80;
    }
    puVar4 = data + uStack_1bc * 0x80;
    local_708 = 0;
    uStack_700 = 0;
    wv_2[0xd] = 0;
    wv_2[0xe] = 0;
    wv_2[0xb] = 0;
    wv_2[0xc] = 0;
    wv_2[9] = 0;
    wv_2[10] = 0;
    wv_2[7] = 0;
    wv_2[8] = 0;
    wv_2[5] = 0;
    wv_2[6] = 0;
    wv_2[3] = 0;
    wv_2[4] = 0;
    wv_2[1] = 0;
    wv_2[2] = 0;
    uStack_278 = 0;
    wv_2[0] = 0;
    uVar9 = 0x12e058;
    local_720 = &s0;
    wv0_1[0xf] = (uint64_t)FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x0,uVar5);
    puVar6 = &uStack_278;
    prev_00._4_4_ = in_stack_fffffffffffff6fc;
    prev_00._0_4_ = 1;
    prev_00._8_8_ = uVar9;
    Hacl_Hash_Blake2b_update_multi
              (0x80,puVar6,(uint64_t *)local_720,(FStar_UInt128_uint128)prev_00,
               (uint8_t *)wv0_1[0xf],nb);
    wv0_1[0xd] = local_708;
    wv0_1[0xe] = uStack_700;
    wv0_1[0xb] = local_708;
    wv0_1[0xc] = uStack_700;
    wv0_1[9] = local_708;
    wv0_1[10] = uStack_700;
    wv0_1[7] = local_708;
    wv0_1[8] = uStack_700;
    wv0_1[5] = local_708;
    wv0_1[6] = uStack_700;
    wv0_1[3] = local_708;
    wv0_1[4] = uStack_700;
    wv0_1[1] = local_708;
    wv0_1[2] = uStack_700;
    uStack_318 = local_708;
    wv0_1[0] = uStack_700;
    local_714 = uStack_1bc << 7;
    uVar9 = 0x12e12f;
    local_710 = &s0;
    wv1_1[0xf] = (uint64_t)
                 FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x80,(uint64_t)puVar6);
    puVar6 = &uStack_318;
    prev_01._4_4_ = in_stack_fffffffffffff6fc;
    prev_01._0_4_ = uStack_1bc;
    prev_01._8_8_ = uVar9;
    Hacl_Hash_Blake2b_update_multi
              (local_714,puVar6,(uint64_t *)local_710,(FStar_UInt128_uint128)prev_01,
               (uint8_t *)wv1_1[0xf],nb_00);
    wv1_1[0xd] = local_708;
    wv1_1[0xe] = uStack_700;
    wv1_1[0xb] = local_708;
    wv1_1[0xc] = uStack_700;
    wv1_1[9] = local_708;
    wv1_1[10] = uStack_700;
    wv1_1[7] = local_708;
    wv1_1[8] = uStack_700;
    wv1_1[5] = local_708;
    wv1_1[6] = uStack_700;
    wv1_1[3] = local_708;
    wv1_1[4] = uStack_700;
    wv1_1[1] = local_708;
    wv1_1[2] = uStack_700;
    uStack_3b8 = local_708;
    wv1_1[0] = uStack_700;
    local_6dc = n_blocks_;
    local_6d8 = &uStack_3b8;
    local_6d0 = &s0;
    local_6e8 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x80,(uint64_t)puVar6);
    FStar_UInt128_uint64_to_uint128
              ((FStar_UInt128_uint128 *)(ulong)(uStack_1bc * 0x80),(uint64_t)puVar6);
    uVar9 = 0x12e2b5;
    pFVar3 = FStar_UInt128_add(local_6e8,(uint128_t)in_stack_fffffffffffff708,
                               (uint128_t)in_stack_fffffffffffff718);
    prev_02._8_8_ = uVar9;
    prev_02._0_8_ = puVar4;
    Hacl_Hash_Blake2b_update_last
              (local_6dc,local_6d8,(uint64_t *)local_6d0,(FStar_UInt128_uint128)prev_02,
               (uint32_t)pFVar3,d_00);
  }
  Hacl_Hash_Blake2b_finish(0x40,(uint8_t *)wv_1[0xf],(uint64_t *)&s0);
  puVar2 = local_698;
  uVar5 = 0;
  Hacl_Hash_Blake2b_init((uint64_t *)&s0,0,0x40);
  uVar8 = (undefined4)((ulong)puVar4 >> 0x20);
  wv[0xf] = (uint64_t)puVar2;
  local_758 = 0;
  uStack_750 = 0;
  wv[0xd] = 0;
  wv[0xe] = 0;
  wv[0xb] = 0;
  wv[0xc] = 0;
  wv[9] = 0;
  wv[10] = 0;
  wv[7] = 0;
  wv[8] = 0;
  wv[5] = 0;
  wv[6] = 0;
  wv[3] = 0;
  wv[4] = 0;
  wv[1] = 0;
  wv[2] = 0;
  uStack_4e8 = 0;
  wv[0] = 0;
  uVar9 = 0x12e4b7;
  local_770 = &s0;
  wv0[0xf] = (uint64_t)FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x0,uVar5);
  puVar6 = &uStack_4e8;
  prev_03._4_4_ = uVar8;
  prev_03._0_4_ = 1;
  prev_03._8_8_ = uVar9;
  Hacl_Hash_Blake2b_update_multi
            (0x80,puVar6,(uint64_t *)local_770,(FStar_UInt128_uint128)prev_03,(uint8_t *)wv0[0xf],
             nb_01);
  wv0[0xd] = local_758;
  wv0[0xe] = uStack_750;
  wv0[0xb] = local_758;
  wv0[0xc] = uStack_750;
  wv0[9] = local_758;
  wv0[10] = uStack_750;
  wv0[7] = local_758;
  wv0[8] = uStack_750;
  wv0[5] = local_758;
  wv0[6] = uStack_750;
  wv0[3] = local_758;
  wv0[4] = uStack_750;
  wv0[1] = local_758;
  wv0[2] = uStack_750;
  uStack_588 = local_758;
  wv0[0] = uStack_750;
  local_764 = 0;
  uVar9 = 0x12e58e;
  local_760 = &s0;
  wv1[0xf] = (uint64_t)
             FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x80,(uint64_t)puVar6);
  puVar6 = &uStack_588;
  auVar1._4_8_ = uVar9;
  auVar1._0_4_ = uVar8;
  auVar1._12_4_ = 0;
  Hacl_Hash_Blake2b_update_multi
            (local_764,puVar6,(uint64_t *)local_760,(FStar_UInt128_uint128)(auVar1 << 0x20),
             (uint8_t *)wv1[0xf],nb_02);
  wv1[0xd] = local_758;
  wv1[0xe] = uStack_750;
  wv1[0xb] = local_758;
  wv1[0xc] = uStack_750;
  wv1[9] = local_758;
  wv1[10] = uStack_750;
  wv1[7] = local_758;
  wv1[8] = uStack_750;
  wv1[5] = local_758;
  wv1[6] = uStack_750;
  wv1[3] = local_758;
  wv1[4] = uStack_750;
  wv1[1] = local_758;
  wv1[2] = uStack_750;
  uStack_628 = local_758;
  wv1[0] = uStack_750;
  local_734 = 0x40;
  local_730 = &uStack_628;
  local_728 = &s0;
  local_740 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x80,(uint64_t)puVar6);
  local_748 = extraout_RDX;
  local_638 = local_740;
  local_648 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x0,(uint64_t)puVar6);
  local_640 = extraout_RDX_00;
  local_650 = local_748;
  local_658 = local_740;
  local_660 = extraout_RDX_00;
  local_668 = local_648;
  uVar9 = 0x12e714;
  local_678 = FStar_UInt128_add(local_740,(uint128_t)in_stack_fffffffffffff708,
                                (uint128_t)in_stack_fffffffffffff718);
  local_670 = d_01;
  local_680 = d_01;
  local_688 = local_678;
  prev_04._8_8_ = uVar9;
  prev_04._0_8_ = wv[0xf];
  Hacl_Hash_Blake2b_update_last
            (local_734,local_730,(uint64_t *)local_728,(FStar_UInt128_uint128)prev_04,
             (uint32_t)local_678,d_01);
  Hacl_Hash_Blake2b_finish(0x40,dst,(uint64_t *)&s0);
  return;
}

Assistant:

void
Hacl_HMAC_compute_blake2b_32(
  uint8_t *dst,
  uint8_t *key,
  uint32_t key_len,
  uint8_t *data,
  uint32_t data_len
)
{
  uint32_t l = 128U;
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t key_block[l];
  memset(key_block, 0U, l * sizeof (uint8_t));
  uint8_t *nkey = key_block;
  uint32_t ite;
  if (key_len <= 128U)
  {
    ite = key_len;
  }
  else
  {
    ite = 64U;
  }
  uint8_t *zeroes = key_block + ite;
  KRML_MAYBE_UNUSED_VAR(zeroes);
  if (key_len <= 128U)
  {
    memcpy(nkey, key, key_len * sizeof (uint8_t));
  }
  else
  {
    Hacl_Hash_Blake2b_hash_with_key(nkey, 64U, key, key_len, NULL, 0U);
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t ipad[l];
  memset(ipad, 0x36U, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = ipad[i];
    uint8_t yi = key_block[i];
    ipad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t opad[l];
  memset(opad, 0x5cU, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = opad[i];
    uint8_t yi = key_block[i];
    opad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  uint64_t s[16U] = { 0U };
  Hacl_Hash_Blake2b_init(s, 0U, 64U);
  uint64_t *s0 = s;
  uint8_t *dst1 = ipad;
  if (data_len == 0U)
  {
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), 128U, ipad);
  }
  else
  {
    uint32_t block_len = 128U;
    uint32_t n_blocks0 = data_len / block_len;
    uint32_t rem0 = data_len % block_len;
    K___uint32_t_uint32_t scrut;
    if (n_blocks0 > 0U && rem0 == 0U)
    {
      uint32_t n_blocks_ = n_blocks0 - 1U;
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = data_len - n_blocks_ * block_len });
    }
    else
    {
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
    }
    uint32_t n_blocks = scrut.fst;
    uint32_t rem_len = scrut.snd;
    uint32_t full_blocks_len = n_blocks * block_len;
    uint8_t *full_blocks = data;
    uint8_t *rem = data + full_blocks_len;
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_multi(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), ipad, 1U);
    uint64_t wv0[16U] = { 0U };
    Hacl_Hash_Blake2b_update_multi(n_blocks * 128U,
      wv0,
      s0,
      FStar_UInt128_uint64_to_uint128((uint64_t)block_len),
      full_blocks,
      n_blocks);
    uint64_t wv1[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(rem_len,
      wv1,
      s0,
      FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
        FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
      rem_len,
      rem);
  }
  Hacl_Hash_Blake2b_finish(64U, dst1, s0);
  uint8_t *hash1 = ipad;
  Hacl_Hash_Blake2b_init(s0, 0U, 64U);
  uint32_t block_len = 128U;
  uint32_t n_blocks0 = 64U / block_len;
  uint32_t rem0 = 64U % block_len;
  K___uint32_t_uint32_t scrut;
  if (n_blocks0 > 0U && rem0 == 0U)
  {
    uint32_t n_blocks_ = n_blocks0 - 1U;
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = 64U - n_blocks_ * block_len });
  }
  else
  {
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
  }
  uint32_t n_blocks = scrut.fst;
  uint32_t rem_len = scrut.snd;
  uint32_t full_blocks_len = n_blocks * block_len;
  uint8_t *full_blocks = hash1;
  uint8_t *rem = hash1 + full_blocks_len;
  uint64_t wv[16U] = { 0U };
  Hacl_Hash_Blake2b_update_multi(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), opad, 1U);
  uint64_t wv0[16U] = { 0U };
  Hacl_Hash_Blake2b_update_multi(n_blocks * 128U,
    wv0,
    s0,
    FStar_UInt128_uint64_to_uint128((uint64_t)block_len),
    full_blocks,
    n_blocks);
  uint64_t wv1[16U] = { 0U };
  Hacl_Hash_Blake2b_update_last(rem_len,
    wv1,
    s0,
    FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
      FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
    rem_len,
    rem);
  Hacl_Hash_Blake2b_finish(64U, dst, s0);
}